

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void vera::texelCoordToVec(float *_out3f,float _u,float _v,uint8_t _faceId)

{
  ulong uVar1;
  undefined3 in_register_00000031;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = (ulong)CONCAT31(in_register_00000031,_faceId);
  fVar4 = *(float *)(cubemapUV + uVar1 * 0x24 + 8) * _u +
          *(float *)(cubemapUV + uVar1 * 0x24 + 0x14) * _v +
          *(float *)(cubemapUV + uVar1 * 0x24 + 0x20);
  fVar2 = (float)*(undefined8 *)(cubemapUV + uVar1 * 0x24 + 0x18) +
          _u * *(float *)(cubemapUV + uVar1 * 0x24) + _v * 0.0;
  fVar3 = (float)((ulong)*(undefined8 *)(cubemapUV + uVar1 * 0x24 + 0x18) >> 0x20) +
          _u * 0.0 + *(float *)(cubemapUV + uVar1 * 0x24 + 0x10) * _v;
  fVar5 = 1.0 / SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  *(ulong *)_out3f = CONCAT44(fVar5 * fVar3,fVar5 * fVar2);
  _out3f[2] = fVar5 * fVar4;
  return;
}

Assistant:

void texelCoordToVec(float* _out3f, float _u, float _v, uint8_t _faceId) {
    // out = u * s_faceUv[0] + v * s_faceUv[1] + s_faceUv[2].
    _out3f[0] = cubemapUV[_faceId][0][0] * _u + cubemapUV[_faceId][1][0] * _v + cubemapUV[_faceId][2][0];
    _out3f[1] = cubemapUV[_faceId][0][1] * _u + cubemapUV[_faceId][1][1] * _v + cubemapUV[_faceId][2][1];
    _out3f[2] = cubemapUV[_faceId][0][2] * _u + cubemapUV[_faceId][1][2] * _v + cubemapUV[_faceId][2][2];

    // Normalize.
    const float invLen = 1.0f/sqrtf(_out3f[0]*_out3f[0] + _out3f[1]*_out3f[1] + _out3f[2]*_out3f[2]);
    _out3f[0] *= invLen;
    _out3f[1] *= invLen;
    _out3f[2] *= invLen;
}